

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cProgramInterfaceQueryTests.cpp
# Opt level: O1

string * __thiscall
gl4cts::(anonymous_namespace)::SubroutinesBase::GeometryShader_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             "#version 430                                                  \nlayout(triangles) in;                                         \nlayout(triangle_strip, max_vertices = 4) out;                 \nsubroutine vec4 a_t();               \nsubroutine uniform a_t a;            \nsubroutine(a_t) vec4 x() {           \n   return vec4(1);                   \n}                                    \nvoid main() {                              \n   gl_Position = vec4(-1, 1, 0, 1);        \n   EmitVertex();                           \n   gl_Position = vec4(-1, -1, 0, 1);       \n   EmitVertex();                           \n   gl_Position = vec4(1, 1, 0, 1);         \n   EmitVertex();                           \n   gl_Position = a();                      \n   EmitVertex();                           \n   EndPrimitive();                         \n}"
             ,"");
  return __return_storage_ptr__;
}

Assistant:

virtual std::string GeometryShader()
	{
		return "#version 430                                                  \n"
			   "layout(triangles) in;                                         \n"
			   "layout(triangle_strip, max_vertices = 4) out;                 \n"
			   ""
			   "subroutine vec4 a_t();               \n"
			   "subroutine uniform a_t a;            \n"
			   "subroutine(a_t) vec4 x() {           \n"
			   "   return vec4(1);                   \n"
			   "}                                    \n"
			   ""
			   "void main() {                              \n"
			   "   gl_Position = vec4(-1, 1, 0, 1);        \n"
			   "   EmitVertex();                           \n"
			   "   gl_Position = vec4(-1, -1, 0, 1);       \n"
			   "   EmitVertex();                           \n"
			   "   gl_Position = vec4(1, 1, 0, 1);         \n"
			   "   EmitVertex();                           \n"
			   "   gl_Position = a();                      \n"
			   "   EmitVertex();                           \n"
			   "   EndPrimitive();                         \n"
			   "}";
	}